

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

void cumfnc(double *f,double *dfn,double *dfd,double *pnonc,double *cum,double *ccum)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *ccum_local;
  double *cum_local;
  double *pnonc_local;
  double *dfd_local;
  double *dfn_local;
  double *f_local;
  
  if (*f <= 0.0) {
    *cum = 0.0;
    *ccum = 1.0;
  }
  else if (*pnonc <= 1e-10 && *pnonc != 1e-10) {
    cumf(f,dfn,dfd,cum,ccum);
  }
  else {
    cumfnc::xnonc = *pnonc / 2.0;
    cumfnc::icent = (int)cumfnc::xnonc;
    if (cumfnc::icent == 0) {
      cumfnc::icent = 1;
    }
    cumfnc::T1 = (double)(cumfnc::icent + 1);
    dVar1 = -cumfnc::xnonc;
    dVar2 = (double)cumfnc::icent;
    dVar3 = log(cumfnc::xnonc);
    dVar4 = alngam(&cumfnc::T1);
    cumfnc::centwt = exp((dVar2 * dVar3 + dVar1) - dVar4);
    cumfnc::prod = *dfn * *f;
    cumfnc::dsum = *dfd + cumfnc::prod;
    cumfnc::yy = *dfd / cumfnc::dsum;
    if (cumfnc::yy <= 0.5) {
      cumfnc::xx = 1.0 - cumfnc::yy;
    }
    else {
      cumfnc::xx = cumfnc::prod / cumfnc::dsum;
      cumfnc::yy = 1.0 - cumfnc::xx;
    }
    cumfnc::T2 = *dfn * 0.5 + (double)cumfnc::icent;
    cumfnc::T3 = *dfd * 0.5;
    bratio(&cumfnc::T2,&cumfnc::T3,&cumfnc::xx,&cumfnc::yy,&cumfnc::betdn,&cumfnc::dummy,
           &cumfnc::ierr);
    cumfnc::adn = *dfn / 2.0 + (double)cumfnc::icent;
    cumfnc::b = *dfd / 2.0;
    cumfnc::betup = cumfnc::betdn;
    cumfnc::sum = cumfnc::centwt * cumfnc::betdn;
    cumfnc::xmult = cumfnc::centwt;
    cumfnc::i = cumfnc::icent;
    cumfnc::T4 = cumfnc::adn + cumfnc::b;
    cumfnc::T5 = cumfnc::adn + 1.0;
    cumfnc::aup = cumfnc::adn;
    dVar3 = alngam(&cumfnc::T4);
    dVar4 = alngam(&cumfnc::T5);
    dVar5 = alngam(&cumfnc::b);
    dVar1 = cumfnc::adn;
    dVar6 = log(cumfnc::xx);
    dVar2 = cumfnc::b;
    dVar7 = log(cumfnc::yy);
    cumfnc::dnterm = exp(dVar2 * dVar7 + dVar1 * dVar6 + ((dVar3 - dVar4) - dVar5));
    for (; (1e-20 <= cumfnc::sum && cumfnc::eps * cumfnc::sum <= cumfnc::xmult * cumfnc::betdn &&
           (0 < cumfnc::i)); cumfnc::i = cumfnc::i + -1) {
      cumfnc::xmult = ((double)cumfnc::i / cumfnc::xnonc) * cumfnc::xmult;
      cumfnc::adn = cumfnc::adn - 1.0;
      cumfnc::dnterm =
           ((cumfnc::adn + 1.0) / ((cumfnc::adn + cumfnc::b) * cumfnc::xx)) * cumfnc::dnterm;
      cumfnc::betdn = cumfnc::dnterm + cumfnc::betdn;
      cumfnc::sum = cumfnc::xmult * cumfnc::betdn + cumfnc::sum;
    }
    cumfnc::i = cumfnc::icent + 1;
    cumfnc::xmult = cumfnc::centwt;
    dVar1 = (cumfnc::aup - 1.0) + cumfnc::b;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      cumfnc::T6 = (cumfnc::aup - 1.0) + cumfnc::b;
      dVar2 = alngam(&cumfnc::T6);
      dVar3 = alngam(&cumfnc::aup);
      dVar4 = alngam(&cumfnc::b);
      dVar5 = cumfnc::aup - 1.0;
      dVar6 = log(cumfnc::xx);
      dVar1 = cumfnc::b;
      dVar7 = log(cumfnc::yy);
      cumfnc::upterm = exp(dVar1 * dVar7 + dVar5 * dVar6 + ((dVar2 - dVar3) - dVar4));
    }
    else {
      dVar2 = alngam(&cumfnc::aup);
      dVar3 = alngam(&cumfnc::b);
      dVar4 = cumfnc::aup - 1.0;
      dVar5 = log(cumfnc::xx);
      dVar1 = cumfnc::b;
      dVar6 = log(cumfnc::yy);
      cumfnc::upterm = exp(dVar1 * dVar6 + dVar4 * dVar5 + (-dVar2 - dVar3));
    }
    do {
      cumfnc::xmult = (cumfnc::xnonc / (double)cumfnc::i) * cumfnc::xmult;
      cumfnc::i = cumfnc::i + 1;
      cumfnc::aup = cumfnc::aup + 1.0;
      cumfnc::upterm =
           ((((cumfnc::aup + cumfnc::b) - 2.0) * cumfnc::xx) / (cumfnc::aup - 1.0)) * cumfnc::upterm
      ;
      cumfnc::betup = cumfnc::betup - cumfnc::upterm;
      cumfnc::sum = cumfnc::xmult * cumfnc::betup + cumfnc::sum;
    } while (1e-20 <= cumfnc::sum && cumfnc::eps * cumfnc::sum <= cumfnc::xmult * cumfnc::betup);
    *cum = cumfnc::sum;
    *ccum = (0.5 - *cum) + 0.5;
  }
  return;
}

Assistant:

void cumfnc(double *f,double *dfn,double *dfd,double *pnonc,
            double *cum,double *ccum)
/*
**********************************************************************

               F -NON- -C-ENTRAL F DISTRIBUTION



                              Function


     COMPUTES NONCENTRAL F DISTRIBUTION WITH DFN AND DFD
     DEGREES OF FREEDOM AND NONCENTRALITY PARAMETER PNONC


                              Arguments


     X --> UPPER LIMIT OF INTEGRATION OF NONCENTRAL F IN EQUATION

     DFN --> DEGREES OF FREEDOM OF NUMERATOR

     DFD -->  DEGREES OF FREEDOM OF DENOMINATOR

     PNONC --> NONCENTRALITY PARAMETER.

     CUM <-- CUMULATIVE NONCENTRAL F DISTRIBUTION

     CCUM <-- COMPLIMENT OF CUMMULATIVE


                              Method


     USES FORMULA 26.6.20 OF REFERENCE FOR INFINITE SERIES.
     SERIES IS CALCULATED BACKWARD AND FORWARD FROM J = LAMBDA/2
     (THIS IS THE TERM WITH THE LARGEST POISSON WEIGHT) UNTIL
     THE CONVERGENCE CRITERION IS MET.

     FOR SPEED, THE INCOMPLETE BETA FUNCTIONS ARE EVALUATED
     BY FORMULA 26.5.16.


               REFERENCE


     HANDBOOD OF MATHEMATICAL FUNCTIONS
     EDITED BY MILTON ABRAMOWITZ AND IRENE A. STEGUN
     NATIONAL BUREAU OF STANDARDS APPLIED MATEMATICS SERIES - 55
     MARCH 1965
     P 947, EQUATIONS 26.6.17, 26.6.18


                              Note


     THE SUM CONTINUES UNTIL A SUCCEEDING TERM IS LESS THAN EPS
     TIMES THE SUM (OR THE SUM IS LESS THAN 1.0E-20).  EPS IS
     SET TO 1.0E-4 IN A DATA STATEMENT WHICH CAN BE CHANGED.

**********************************************************************
*/
{
#define qsmall(x) (int)(sum < 1.0e-20 || (x) < eps*sum)
#define half 0.5e0
#define done 1.0e0
static double eps = 1.0e-4;
static double dsum,dummy,prod,xx,yy,adn,aup,b,betdn,betup,centwt,dnterm,sum,
    upterm,xmult,xnonc;
static int i,icent,ierr;
static double T1,T2,T3,T4,T5,T6;
/*
     ..
     .. Executable Statements ..
*/
    if(!(*f <= 0.0e0)) goto S10;
    *cum = 0.0e0;
    *ccum = 1.0e0;
    return;
S10:
    if(!(*pnonc < 1.0e-10)) goto S20;
/*
     Handle case in which the non-centrality parameter is
     (essentially) zero.
*/
    cumf(f,dfn,dfd,cum,ccum);
    return;
S20:
    xnonc = *pnonc/2.0e0;
/*
     Calculate the central term of the poisson weighting factor.
*/
    icent = xnonc;
    if(icent == 0) icent = 1;
/*
     Compute central weight term
*/
    T1 = (double)(icent+1);
    centwt = exp(-xnonc+(double)icent*log(xnonc)-alngam(&T1));
/*
     Compute central incomplete beta term
     Assure that minimum of arg to beta and 1 - arg is computed
          accurately.
*/
    prod = *dfn**f;
    dsum = *dfd+prod;
    yy = *dfd/dsum;
    if(yy > half) {
        xx = prod/dsum;
        yy = done-xx;
    }
    else  xx = done-yy;
    T2 = *dfn*half+(double)icent;
    T3 = *dfd*half;
    bratio(&T2,&T3,&xx,&yy,&betdn,&dummy,&ierr);
    adn = *dfn/2.0e0+(double)icent;
    aup = adn;
    b = *dfd/2.0e0;
    betup = betdn;
    sum = centwt*betdn;
/*
     Now sum terms backward from icent until convergence or all done
*/
    xmult = centwt;
    i = icent;
    T4 = adn+b;
    T5 = adn+1.0e0;
    dnterm = exp(alngam(&T4)-alngam(&T5)-alngam(&b)+adn*log(xx)+b*log(yy));
S30:
    if(qsmall(xmult*betdn) || i <= 0) goto S40;
    xmult *= ((double)i/xnonc);
    i -= 1;
    adn -= 1.0;
    dnterm = (adn+1.0)/((adn+b)*xx)*dnterm;
    betdn += dnterm;
    sum += (xmult*betdn);
    goto S30;
S40:
    i = icent+1;
/*
     Now sum forwards until convergence
*/
    xmult = centwt;
    if(aup-1.0+b == 0) upterm = exp(-alngam(&aup)-alngam(&b)+(aup-1.0)*log(xx)+
      b*log(yy));
    else  {
        T6 = aup-1.0+b;
        upterm = exp(alngam(&T6)-alngam(&aup)-alngam(&b)+(aup-1.0)*log(xx)+b*
          log(yy));
    }
    goto S60;
S50:
    if(qsmall(xmult*betup)) goto S70;
S60:
    xmult *= (xnonc/(double)i);
    i += 1;
    aup += 1.0;
    upterm = (aup+b-2.0e0)*xx/(aup-1.0)*upterm;
    betup -= upterm;
    sum += (xmult*betup);
    goto S50;
S70:
    *cum = sum;
    *ccum = 0.5e0+(0.5e0-*cum);
    return;
#undef qsmall
#undef half
#undef done
}